

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

void __thiscall duckdb::SetDefaultInfo::~SetDefaultInfo(SetDefaultInfo *this)

{
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__SetDefaultInfo_0178eb60;
  ::std::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
  ~unique_ptr(&(this->expression).
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             );
  ::std::__cxx11::string::~string((string *)&this->column_name);
  AlterTableInfo::~AlterTableInfo(&this->super_AlterTableInfo);
  return;
}

Assistant:

SetDefaultInfo::~SetDefaultInfo() {
}